

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<WAsmJs::TypedSlotInfo>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,TypedSlotInfo *value)

{
  undefined8 uVar1;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar2;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a4c8;
  uVar1 = *(undefined8 *)&value->tmpCount;
  *(undefined8 *)&value_00->field_0x14 = *(undefined8 *)value;
  *(undefined8 *)((long)&value_00[1]._vptr_BufferBuilder + 4) = uVar1;
  *(Type *)((long)&value_00[1].clue + 4) = value->constSrcByteOffset;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a4a8;
  pIVar2 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar2;
  return 0x14;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }